

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::insert
          (SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this,TypeBase **key)

{
  uint uVar1;
  TypeBase *pTVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  if (*key == (TypeBase *)0x0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<TypeBase *, TypeBaseHasher, 4>::insert(const Key &) [Key = TypeBase *, Hasher = TypeBaseHasher, N = 4]"
                 );
  }
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  uVar1 = this->bucketCount;
  if (uVar1 != 0) {
    uVar3 = this->count;
    uVar4 = (*key)->nameHash & uVar1 - 1;
    uVar5 = 1;
    do {
      pTVar2 = this->data[uVar4];
      if (pTVar2 == (TypeBase *)0x0) {
        this->data[uVar4] = *key;
        uVar3 = uVar3 + 1;
        this->count = uVar3;
LAB_0017e228:
        bVar6 = false;
      }
      else {
        if (pTVar2 == *key) goto LAB_0017e228;
        uVar4 = uVar4 + uVar5 & uVar1 - 1;
        bVar6 = true;
      }
      if (!bVar6) {
        return;
      }
      bVar6 = uVar5 != uVar1;
      uVar5 = uVar5 + 1;
    } while (bVar6);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0xf5,
                "void SmallDenseSet<TypeBase *, TypeBaseHasher, 4>::insert(const Key &) [Key = TypeBase *, Hasher = TypeBaseHasher, N = 4]"
               );
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}